

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::Skip(ZeroCopyCodedInputStream *this,int count)

{
  CodedInputStream *this_00;
  bool bVar1;
  int original_buffer_size;
  
  if (count < 0) {
    return false;
  }
  this_00 = this->cis_;
  original_buffer_size = *(int *)&this_00->buffer_end_ - (int)this_00->buffer_;
  if (count <= original_buffer_size) {
    this_00->buffer_ = this_00->buffer_ + (uint)count;
    return true;
  }
  bVar1 = io::CodedInputStream::SkipFallback(this_00,count,original_buffer_size);
  return bVar1;
}

Assistant:

inline bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  return SkipFallback(count, original_buffer_size);
}